

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

int Extra_TruthMinCofSuppOverlap(uint *pTruth,int nVars,int *pVarMin)

{
  uint uVar1;
  int iVar2;
  uint uWord;
  int iVar3;
  int nVars1;
  int nVars0;
  uint uSupp1;
  uint uSupp0;
  int VarMin;
  int ValueMin;
  int ValueCur;
  int i;
  int *pVarMin_local;
  int nVars_local;
  uint *pTruth_local;
  
  if (9 < nVars) {
    __assert_fail("nVars <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilTruth.c"
                  ,0x30d,"int Extra_TruthMinCofSuppOverlap(unsigned int *, int, int *)");
  }
  uSupp0 = 0x20;
  uSupp1 = 0xffffffff;
  for (ValueMin = 0; ValueMin < nVars; ValueMin = ValueMin + 1) {
    Extra_TruthCopy(Extra_TruthMinCofSuppOverlap::uCofactor,pTruth,nVars);
    Extra_TruthCofactor0(Extra_TruthMinCofSuppOverlap::uCofactor,nVars,ValueMin);
    uVar1 = Extra_TruthSupport(Extra_TruthMinCofSuppOverlap::uCofactor,nVars);
    iVar2 = Extra_WordCountOnes(uVar1);
    Extra_TruthCopy(Extra_TruthMinCofSuppOverlap::uCofactor,pTruth,nVars);
    Extra_TruthCofactor1(Extra_TruthMinCofSuppOverlap::uCofactor,nVars,ValueMin);
    uWord = Extra_TruthSupport(Extra_TruthMinCofSuppOverlap::uCofactor,nVars);
    iVar3 = Extra_WordCountOnes(uWord);
    uVar1 = Extra_WordCountOnes(uVar1 & uWord);
    if ((((int)uVar1 < (int)uSupp0) && (iVar2 < 6)) && (iVar3 < 6)) {
      uSupp1 = ValueMin;
      uSupp0 = uVar1;
    }
    if (uSupp0 == 0) break;
  }
  if (pVarMin != (int *)0x0) {
    *pVarMin = uSupp1;
  }
  return uSupp0;
}

Assistant:

int Extra_TruthMinCofSuppOverlap( unsigned * pTruth, int nVars, int * pVarMin )
{
    static unsigned uCofactor[16];
    int i, ValueCur, ValueMin, VarMin;
    unsigned uSupp0, uSupp1;
    int nVars0, nVars1;
    assert( nVars <= 9 );
    ValueMin = 32;
    VarMin   = -1;
    for ( i = 0; i < nVars; i++ )
    {
        // get negative cofactor
        Extra_TruthCopy( uCofactor, pTruth, nVars );
        Extra_TruthCofactor0( uCofactor, nVars, i );
        uSupp0 = Extra_TruthSupport( uCofactor, nVars );
        nVars0 = Extra_WordCountOnes( uSupp0 );
//Extra_PrintBinary( stdout, &uSupp0, 8 ); printf( "\n" );
        // get positive cofactor
        Extra_TruthCopy( uCofactor, pTruth, nVars );
        Extra_TruthCofactor1( uCofactor, nVars, i );
        uSupp1 = Extra_TruthSupport( uCofactor, nVars );
        nVars1 = Extra_WordCountOnes( uSupp1 );
//Extra_PrintBinary( stdout, &uSupp1, 8 ); printf( "\n" );
        // get the number of common vars
        ValueCur = Extra_WordCountOnes( uSupp0 & uSupp1 );
        if ( ValueMin > ValueCur && nVars0 <= 5 && nVars1 <= 5 )
        {
            ValueMin = ValueCur;
            VarMin = i;
        }
        if ( ValueMin == 0 )
            break;
    }
    if ( pVarMin )
        *pVarMin = VarMin;
    return ValueMin;
}